

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O2

int xmlValidateRoot(xmlValidCtxtPtr ctxt,xmlDocPtr doc)

{
  int iVar1;
  xmlNodePtr node;
  xmlChar *pxVar2;
  xmlChar fn [50];
  
  if (doc == (xmlDocPtr)0x0) {
    return 0;
  }
  node = xmlDocGetRootElement(doc);
  if ((node == (xmlNodePtr)0x0) || (node->name == (xmlChar *)0x0)) {
    xmlErrValid(ctxt,XML_DTD_NO_ROOT,"no root element\n",(char *)0x0);
    return 0;
  }
  if (doc->intSubset == (_xmlDtd *)0x0) {
    return 1;
  }
  pxVar2 = doc->intSubset->name;
  if (pxVar2 != (xmlChar *)0x0) {
    iVar1 = xmlStrEqual(pxVar2,node->name);
    if (iVar1 != 0) {
      return 1;
    }
    if ((node->ns != (xmlNs *)0x0) && (pxVar2 = node->ns->prefix, pxVar2 != (xmlChar *)0x0)) {
      pxVar2 = xmlBuildQName(node->name,pxVar2,fn,0x32);
      if (pxVar2 == (xmlChar *)0x0) {
        xmlVErrMemory(ctxt);
        return 0;
      }
      iVar1 = xmlStrEqual(doc->intSubset->name,pxVar2);
      if ((pxVar2 != fn) && (pxVar2 != node->name)) {
        (*xmlFree)(pxVar2);
      }
      if (iVar1 == 1) {
        return 1;
      }
    }
    iVar1 = xmlStrEqual(doc->intSubset->name,(xmlChar *)"HTML");
    if ((iVar1 != 0) && (iVar1 = xmlStrEqual(node->name,"html"), iVar1 != 0)) {
      return 1;
    }
    xmlErrValidNode(ctxt,node,XML_DTD_ROOT_NAME,"root and DTD name do not match \'%s\' and \'%s\'\n"
                    ,node->name,doc->intSubset->name,(xmlChar *)0x0);
    return 0;
  }
  return 1;
}

Assistant:

int
xmlValidateRoot(xmlValidCtxtPtr ctxt, xmlDocPtr doc) {
    xmlNodePtr root;
    int ret;

    if (doc == NULL) return(0);

    root = xmlDocGetRootElement(doc);
    if ((root == NULL) || (root->name == NULL)) {
	xmlErrValid(ctxt, XML_DTD_NO_ROOT,
	            "no root element\n", NULL);
        return(0);
    }

    /*
     * When doing post validation against a separate DTD, those may
     * no internal subset has been generated
     */
    if ((doc->intSubset != NULL) &&
	(doc->intSubset->name != NULL)) {
	/*
	 * Check first the document root against the NQName
	 */
	if (!xmlStrEqual(doc->intSubset->name, root->name)) {
	    if ((root->ns != NULL) && (root->ns->prefix != NULL)) {
		xmlChar fn[50];
		xmlChar *fullname;

		fullname = xmlBuildQName(root->name, root->ns->prefix, fn, 50);
		if (fullname == NULL) {
		    xmlVErrMemory(ctxt);
		    return(0);
		}
		ret = xmlStrEqual(doc->intSubset->name, fullname);
		if ((fullname != fn) && (fullname != root->name))
		    xmlFree(fullname);
		if (ret == 1)
		    goto name_ok;
	    }
	    if ((xmlStrEqual(doc->intSubset->name, BAD_CAST "HTML")) &&
		(xmlStrEqual(root->name, BAD_CAST "html")))
		goto name_ok;
	    xmlErrValidNode(ctxt, root, XML_DTD_ROOT_NAME,
		   "root and DTD name do not match '%s' and '%s'\n",
		   root->name, doc->intSubset->name, NULL);
	    return(0);
	}
    }
name_ok:
    return(1);
}